

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O1

void __thiscall SimpleLoggerMgr::~SimpleLoggerMgr(SimpleLoggerMgr *this)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  undefined8 uVar5;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_38;
  
  LOCK();
  (this->termination)._M_base._M_i = true;
  UNLOCK();
  signal(0xb,(__sighandler_t)this->oldSigSegvHandler);
  signal(6,(__sighandler_t)this->oldSigAbortHandler);
  local_38._M_device = &this->cvFlusherLock;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  local_38._M_device = &this->cvCompressorLock;
  local_38._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_38);
  local_38._M_owns = true;
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if ((this->tFlush)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->tCompress)._M_id._M_thread != 0) {
    std::thread::join();
  }
  free(this->stackTraceBuffer);
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
  ~vector(&this->crashDumpThreadStacks);
  uVar5 = ___throw_bad_array_new_length;
  lVar4 = _VTT;
  *(long *)&this->crashDumpFile = _VTT;
  *(undefined8 *)(&this->crashDumpFile + *(long *)(lVar4 + -0x18)) = uVar5;
  std::filebuf::~filebuf((filebuf *)&this->field_0x230);
  std::ios_base::~ios_base((ios_base *)&this->field_0x320);
  pcVar1 = (this->crashDumpPath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->crashDumpPath).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->globalCriticalInfo)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->globalCriticalInfo).field_2) {
    operator_delete(pcVar1);
  }
  std::condition_variable::~condition_variable(&this->cvCompressor);
  std::condition_variable::~condition_variable(&this->cvFlusher);
  p_Var3 = (this->pendingCompElems).
           super__List_base<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->pendingCompElems) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  if (((this->tCompress)._M_id._M_thread == 0) && ((this->tFlush)._M_id._M_thread == 0)) {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(this->activeThreads)._M_h);
    std::
    _Hashtable<SimpleLogger_*,_SimpleLogger_*,_std::allocator<SimpleLogger_*>,_std::__detail::_Identity,_std::equal_to<SimpleLogger_*>,_std::hash<SimpleLogger_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(this->loggers)._M_h);
    return;
  }
  std::terminate();
}

Assistant:

SimpleLoggerMgr::~SimpleLoggerMgr() {
    termination = true;

#if defined(__linux__) || defined(__APPLE__)
    signal(SIGSEGV, oldSigSegvHandler);
    signal(SIGABRT, oldSigAbortHandler);
#endif
    {   std::unique_lock<std::mutex> l(cvFlusherLock);
        cvFlusher.notify_all();
    }
    {   std::unique_lock<std::mutex> l(cvCompressorLock);
        cvCompressor.notify_all();
    }
    if (tFlush.joinable()) {
        tFlush.join();
    }
    if (tCompress.joinable()) {
        tCompress.join();
    }

    free(stackTraceBuffer);
}